

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

void resampler_fill_and_remove_delay(resampler *r)

{
  resampler *in_RDI;
  int delay;
  resampler *in_stack_00000020;
  int local_c;
  
  resampler_fill(in_stack_00000020);
  if (in_RDI->delay_removed < '\0') {
    local_c = resampler_output_delay(in_RDI);
    in_RDI->delay_removed = '\0';
    while (local_c != 0) {
      resampler_remove_sample(in_RDI,1);
      local_c = local_c + -1;
    }
  }
  return;
}

Assistant:

static void resampler_fill_and_remove_delay(resampler * r)
{
    resampler_fill( r );
    if ( r->delay_removed < 0 )
    {
        int delay = resampler_output_delay( r );
        r->delay_removed = 0;
        while ( delay-- )
            resampler_remove_sample( r, 1 );
    }
}